

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlibrary.cpp
# Opt level: O1

QFunctionPointer __thiscall QLibrary::resolve(QLibrary *this,char *symbol)

{
  bool bVar1;
  QFunctionPointer p_Var2;
  QLibraryPrivate *this_00;
  
  if ((((this->d).d & 7) != 1) && (bVar1 = load(this), !bVar1)) {
    return (QFunctionPointer)0x0;
  }
  this_00 = (QLibraryPrivate *)((this->d).d & 0xfffffffffffffff8);
  if ((this_00->pHnd).super_QBasicAtomicPointer<void>._q_value._M_b._M_p == (__pointer_type)0x0) {
    return (QFunctionPointer)0x0;
  }
  p_Var2 = QLibraryPrivate::resolve_sys(this_00,symbol);
  return p_Var2;
}

Assistant:

QFunctionPointer QLibrary::resolve(const char *symbol)
{
    if (!isLoaded() && !load())
        return nullptr;
    return d->resolve(symbol);
}